

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

ch_primitive * ch_table_get(ch_table *table,ch_string *key)

{
  ch_table_entry *pcVar1;
  ch_table_entry *entry;
  ch_string *key_local;
  ch_table *table_local;
  
  if (table->size == 0) {
    table_local = (ch_table *)0x0;
  }
  else {
    pcVar1 = find_entry(table->entries,table->capacity,key);
    if (pcVar1->key == (ch_string *)0x0) {
      table_local = (ch_table *)0x0;
    }
    else {
      table_local = (ch_table *)&pcVar1->value;
    }
  }
  return (ch_primitive *)table_local;
}

Assistant:

ch_primitive *ch_table_get(ch_table *table, ch_string *key) {
  if (table->size == 0)
    return NULL;

  ch_table_entry *entry = find_entry(table->entries, table->capacity, key);
  if (entry->key == NULL)
    return NULL;

  return &entry->value;
}